

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseSector(UDMFParser *this,sector_t_conflict *sec,int index)

{
  int *piVar1;
  int *piVar2;
  double dVar3;
  FName FVar4;
  bool bVar5;
  ushort uVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  FDynamicColormap *pFVar13;
  int *piVar14;
  anon_union_4_2_12391d7c_for_PalEntry_0 color;
  uint local_20c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1fc;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1f8;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1f4;
  FString tagstring;
  FString local_1e0;
  FName local_1d4;
  FName local_1d0;
  FName local_1cc;
  DWORD *local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  sector_t_conflict *local_180;
  FNameNoInit *local_178;
  FNameNoInit *local_170;
  WORD *local_168;
  undefined1 local_160 [8];
  undefined1 local_158 [8];
  TVector3<double> local_150;
  FName key;
  int iStack_134;
  FString FStack_130;
  int local_128;
  undefined4 uStack_124;
  
  tagstring.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  memset(sec,0,0x218);
  sec->lightlevel = 0xa0;
  sec->planes[0].xform.xScale = 1.0;
  sec->planes[0].xform.yScale = 1.0;
  sec->planes[1].xform.xScale = 1.0;
  sec->planes[1].xform.yScale = 1.0;
  sec->planes[0].alpha = 1.0;
  sec->planes[1].alpha = 1.0;
  sec->touching_renderthings = (msecnode_t *)0x0;
  sec->touching_thinglist = (msecnode_t *)0x0;
  sec->render_thinglist = (msecnode_t *)0x0;
  sec->seqType = ((level.flags >> 0xc & 1) != 0) - 1;
  sec->prevsec = -1;
  sec->nextsec = -1;
  sec->sectornum = index;
  sec->damageinterval = 0x20;
  sec->terrainnum[0] = -1;
  sec->terrainnum[1] = -1;
  if (this->floordrop == true) {
    sec->Flags = 4;
  }
  sec->gravity = 1.0;
  sec->ZoneNumber = 0xffff;
  sec->friction = 0.90625;
  sec->movefactor = 0.03125;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  piVar1 = &sec->planes[0].Flags;
  piVar2 = &sec->planes[1].Flags;
  local_1c8 = &sec->Flags;
  local_170 = &sec->damagetype;
  local_168 = &sec->MoreFlags;
  local_178 = &sec->SeqName;
  local_188 = 0.0;
  uVar10 = 0;
  local_190 = 0.0;
  local_198 = 0.0;
  local_1b8 = 0.0;
  local_1a0 = 0.0;
  local_1a8 = 0.0;
  local_1b0 = 0.0;
  local_1c0 = 0.0;
  local_20c = 0;
  local_1fc.d = 0xffffffff;
  local_1f8.d = local_1fc.d;
  local_1f4.d = local_1fc.d;
  local_180 = sec;
LAB_0045e58a:
  do {
    bVar5 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar5) {
      if (*(int *)(tagstring.Chars + -0xc) != 0) {
        FScanner::FScanner((FScanner *)&key);
        FString::AttachToOther(&local_1e0,&tagstring);
        FScanner::OpenString((FScanner *)&key,"tagstring",&local_1e0);
        FString::~FString(&local_1e0);
        while (bVar5 = FScanner::CheckNumber((FScanner *)&key), bVar5) {
          if (local_128 != 0) {
            FTagManager::AddSectorTag(&tagManager,index,local_128);
          }
        }
        FScanner::~FScanner((FScanner *)&key);
      }
      if (sec->damageamount == 0) {
        (sec->damagetype).super_FName.Index = 0;
        sec->damageinterval = 0;
        sec->leakydamage = 0;
        sec->Flags = sec->Flags & 0xfffff87f;
      }
      if (uVar10 == 0xf) {
        local_150.X = local_188;
        local_150.Y = local_190;
        local_150.Z = local_198;
        TVector3<double>::Unit((TVector3<double> *)&key,&local_150);
        (sec->floorplane).normal.X = (double)CONCAT44(iStack_134,key.Index);
        (sec->floorplane).normal.Y = (double)FStack_130.Chars;
        (sec->floorplane).normal.Z = (double)CONCAT44(uStack_124,local_128);
        (sec->floorplane).D = local_1b8;
        (sec->floorplane).negiC = -1.0 / (double)CONCAT44(uStack_124,local_128);
      }
      else {
        (sec->floorplane).normal.X = 0.0;
        (sec->floorplane).normal.Y = 0.0;
        dVar3 = sec->planes[0].TexZ;
        (sec->floorplane).normal.Z = 1.0;
        (sec->floorplane).negiC = -1.0;
        (sec->floorplane).D = -dVar3;
      }
      if (local_20c == 0xf) {
        local_150.X = local_1a0;
        local_150.Y = local_1a8;
        local_150.Z = local_1b0;
        TVector3<double>::Unit((TVector3<double> *)&key,&local_150);
        (sec->ceilingplane).normal.X = (double)CONCAT44(iStack_134,key.Index);
        (sec->ceilingplane).normal.Y = (double)FStack_130.Chars;
        (sec->ceilingplane).normal.Z = (double)CONCAT44(uStack_124,local_128);
        (sec->ceilingplane).D = local_1c0;
        (sec->ceilingplane).negiC = -1.0 / (double)CONCAT44(uStack_124,local_128);
      }
      else {
        dVar3 = sec->planes[1].TexZ;
        (sec->ceilingplane).normal.X = 0.0;
        (sec->ceilingplane).normal.Y = 0.0;
        (sec->ceilingplane).normal.Z = -1.0;
        (sec->ceilingplane).negiC = 1.0;
        (sec->ceilingplane).D = dVar3;
      }
      if (((local_1f4.d == 0xffffffff) && (local_1fc.d == 0xffffffff)) &&
         (local_1f8.d == 0xffffffff)) {
        if ((level.outsidefog == 0xff000000) ||
           ((sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W')))) {
          pFVar13 = this->normMap;
          if (pFVar13 == (FDynamicColormap *)0x0) {
            pFVar13 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.fadeto,
                                       NormalLight.Desaturate);
            this->normMap = pFVar13;
          }
        }
        else {
          pFVar13 = this->fogMap;
          if (pFVar13 == (FDynamicColormap *)0x0) {
            pFVar13 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.outsidefog,0);
            this->fogMap = pFVar13;
          }
        }
      }
      else {
        color.d = 0xffffff;
        if (local_1f4.d != 0xffffffff) {
          color = local_1f4;
        }
        if ((local_1fc.d == 0xffffffff) &&
           ((level.outsidefog == 0xff000000 ||
            ((local_1fc = (anon_union_4_2_12391d7c_for_PalEntry_0)level.outsidefog,
             sec->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sec->special != 'W'))))))
        {
          local_1fc = (anon_union_4_2_12391d7c_for_PalEntry_0)level.fadeto;
        }
        if (local_1f8.d == 0xffffffff) {
          local_1f8 = (anon_union_4_2_12391d7c_for_PalEntry_0)NormalLight.Desaturate;
        }
        pFVar13 = GetSpecialLights((PalEntry)color.field_0,(PalEntry)local_1fc,local_1f8.d);
      }
      sec->ColorMap = pFVar13;
      FString::~FString(&tagstring);
      return;
    }
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
    switch(key.Index) {
    case 299:
      dVar3 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[299].Text);
      sec->planes[0].TexZ = dVar3;
      goto LAB_0045e58a;
    case 300:
      dVar3 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[300].Text);
      sec->planes[1].TexZ = dVar3;
      goto LAB_0045e58a;
    case 0x12d:
      iVar8 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x12d].Text);
      if (0x7ffe < iVar8) {
        iVar8 = 0x7fff;
      }
      sVar7 = (short)iVar8;
      if (iVar8 < -0x7fff) {
        sVar7 = -0x8000;
      }
      sec->lightlevel = sVar7;
      goto LAB_0045e58a;
    case 0x12e:
      pcVar11 = UDMFParserBase::CheckString
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x12e].Text);
      iVar8 = 0;
      goto LAB_0045e6f3;
    case 0x12f:
      pcVar11 = UDMFParserBase::CheckString
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x12f].Text);
      iVar8 = 1;
LAB_0045e6f3:
      SetTexture(sec,index,iVar8,pcVar11,this->missingTex,false);
      goto LAB_0045e58a;
    }
    if (key.Index == 0xed) break;
    if (key.Index != 0x11f) {
      if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0)
      goto switchD_0045e744_caseD_1b0;
      iVar8 = 0x40;
      piVar14 = piVar1;
      switch(key.Index) {
      case 399:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[399].Text);
        sec->planes[0].xform.xOffs = dVar3;
        goto LAB_0045e58a;
      case 400:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[400].Text);
        sec->planes[0].xform.yOffs = dVar3;
        goto LAB_0045e58a;
      case 0x191:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x191].Text);
        sec->planes[1].xform.xOffs = dVar3;
        goto LAB_0045e58a;
      case 0x192:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x192].Text);
        sec->planes[1].xform.yOffs = dVar3;
        goto LAB_0045e58a;
      case 0x193:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x193].Text);
        sec->planes[0].xform.xScale = dVar3;
        goto LAB_0045e58a;
      case 0x194:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x194].Text);
        sec->planes[0].xform.yScale = dVar3;
        goto LAB_0045e58a;
      case 0x195:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x195].Text);
        sec->planes[1].xform.xScale = dVar3;
        goto LAB_0045e58a;
      case 0x196:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x196].Text);
        sec->planes[1].xform.yScale = dVar3;
        goto LAB_0045e58a;
      case 0x197:
        UDMFParserBase::CheckAngle((UDMFParserBase *)local_158,(char *)this);
        sec->planes[0].xform.Angle.Degrees = (double)local_158;
        goto LAB_0045e58a;
      case 0x198:
        UDMFParserBase::CheckAngle((UDMFParserBase *)local_160,(char *)this);
        sec->planes[1].xform.Angle.Degrees = (double)local_160;
        goto LAB_0045e58a;
      case 0x199:
        iVar8 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x199].Text);
        sec->planes[0].Light = iVar8;
        goto LAB_0045e58a;
      case 0x19a:
        iVar8 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19a].Text);
        sec->planes[1].Light = iVar8;
        goto LAB_0045e58a;
      case 0x19b:
        bVar5 = UDMFParserBase::CheckBool
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19b].Text);
        if (bVar5) {
          *piVar1 = *piVar1 | 1;
        }
        else {
          *piVar1 = *piVar1 & 0xfffffffe;
        }
        goto LAB_0045e58a;
      case 0x19c:
        bVar5 = UDMFParserBase::CheckBool
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19c].Text);
        if (bVar5) {
          *piVar2 = *piVar2 | 1;
        }
        else {
          *piVar2 = *piVar2 & 0xfffffffe;
        }
        goto LAB_0045e58a;
      case 0x19d:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19d].Text);
        sec->gravity = dVar3;
        goto LAB_0045e58a;
      case 0x19e:
        local_1f4.d = UDMFParserBase::CheckInt
                                (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19e].Text);
        goto LAB_0045e58a;
      case 0x19f:
        local_1fc.d = UDMFParserBase::CheckInt
                                (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19f].Text);
        goto LAB_0045e58a;
      case 0x1a0:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a0].Text);
        local_1f8.d = (uint32)(dVar3 * 255.0);
        goto LAB_0045e58a;
      case 0x1a1:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a1].Text);
        FNameNoInit::operator=(local_178,pcVar11);
        sec->seqType = -1;
        goto LAB_0045e58a;
      case 0x1a2:
        lVar12 = 0x1a20;
        iVar8 = 1;
        goto LAB_0045eddf;
      case 0x1a3:
        lVar12 = 0x1a30;
        iVar8 = 2;
        goto LAB_0045eddf;
      case 0x1a4:
        iVar8 = 4;
        lVar12 = 0x1a40;
        goto LAB_0045eddf;
      case 0x1a5:
        iVar8 = 8;
        lVar12 = 0x1a50;
LAB_0045eddf:
        UDMFParserBase::Flag<unsigned_int>
                  (&this->super_UDMFParserBase,local_1c8,iVar8,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar12));
        goto LAB_0045e58a;
      case 0x1a6:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a6].Text);
        sec->planes[0].alpha = dVar3;
        goto LAB_0045e58a;
      case 0x1a7:
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a7].Text);
        sec->planes[1].alpha = dVar3;
        goto LAB_0045e58a;
      case 0x1a8:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a8].Text);
        iVar8 = strcasecmp(pcVar11,"translucent");
        if (iVar8 == 0) {
          *(byte *)piVar1 = (byte)*piVar1 & 0xfb;
        }
        else {
          iVar8 = strcasecmp(pcVar11,"add");
          if (iVar8 == 0) {
            *(byte *)piVar1 = (byte)*piVar1 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstylefloor\'\n",pcVar11);
          }
        }
        goto LAB_0045e58a;
      case 0x1a9:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1a9].Text);
        iVar8 = strcasecmp(pcVar11,"translucent");
        if (iVar8 == 0) {
          *(byte *)piVar2 = (byte)*piVar2 & 0xfb;
        }
        else {
          iVar8 = strcasecmp(pcVar11,"add");
          if (iVar8 == 0) {
            *(byte *)piVar2 = (byte)*piVar2 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyleceiling\'\n",pcVar11)
            ;
          }
        }
        goto LAB_0045e58a;
      case 0x1aa:
        iVar8 = 0x20;
        lVar12 = 0x1aa0;
        goto LAB_0045ef1b;
      case 0x1ab:
        lVar12 = 0x1ab0;
        piVar14 = piVar2;
        goto LAB_0045f033;
      case 0x1ac:
        lVar12 = 0x1ac0;
        piVar14 = piVar2;
        goto LAB_0045f065;
      case 0x1ad:
        lVar12 = 0x1ad0;
        piVar14 = piVar2;
        goto LAB_0045f063;
      case 0x1ae:
        lVar12 = 0x1ae0;
        piVar14 = piVar2;
        goto LAB_0045f027;
      case 0x1af:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1af].Text);
        iVar8 = strcasecmp(pcVar11,"translucent");
        if (iVar8 == 0) {
          *(byte *)piVar2 = (byte)*piVar2 & 0xfb;
        }
        else {
          pcVar11 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[key.Index].Text
                              );
          iVar8 = strcasecmp(pcVar11,"additive");
          if (iVar8 == 0) {
            *(byte *)piVar2 = (byte)*piVar2 | 4;
          }
        }
        break;
      case 0x1b0:
      case 0x1b6:
      case 0x1b7:
      case 0x1b8:
      case 0x1b9:
      case 0x1ba:
      case 0x1bb:
      case 0x1bc:
      case 0x1bd:
      case 0x1be:
      case 0x1bf:
      case 0x1c0:
      case 0x1c1:
      case 0x1c2:
      case 0x1c3:
      case 0x1c4:
      case 0x1c5:
      case 0x1c6:
      case 0x1c7:
      case 0x1c8:
      case 0x1c9:
      case 0x1cb:
      case 0x1cc:
      case 0x1cd:
        break;
      case 0x1b1:
        lVar12 = 0x1b10;
LAB_0045f033:
        iVar8 = 0x20;
        goto LAB_0045f065;
      case 0x1b2:
        lVar12 = 0x1b20;
        goto LAB_0045f065;
      case 0x1b3:
        lVar12 = 0x1b30;
LAB_0045f063:
        iVar8 = 0x10;
        goto LAB_0045f065;
      case 0x1b4:
        lVar12 = 0x1b40;
LAB_0045f027:
        iVar8 = 8;
LAB_0045f065:
        UDMFParserBase::Flag<int>
                  (&this->super_UDMFParserBase,piVar14,iVar8,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar12));
        break;
      case 0x1b5:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b5].Text);
        iVar8 = strcasecmp(pcVar11,"translucent");
        if (iVar8 == 0) {
          *(byte *)piVar1 = (byte)*piVar1 & 0xfb;
        }
        else {
          pcVar11 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[key.Index].Text
                              );
          iVar8 = strcasecmp(pcVar11,"additive");
          if (iVar8 == 0) {
            *(byte *)piVar1 = (byte)*piVar1 | 4;
          }
        }
        break;
      case 0x1ca:
        iVar8 = 0x100;
        lVar12 = 0x1ca0;
LAB_0045ef1b:
        UDMFParserBase::Flag<unsigned_short>
                  (&this->super_UDMFParserBase,local_168,iVar8,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar12));
        break;
      case 0x1ce:
        local_1a0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ce].Text);
        local_20c = local_20c | 1;
        break;
      case 0x1cf:
        local_1a8 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1cf].Text);
        local_20c = local_20c | 2;
        break;
      case 0x1d0:
        local_1b0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d0].Text);
        local_20c = local_20c | 4;
        break;
      case 0x1d1:
        local_1c0 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d1].Text);
        local_20c = local_20c | 8;
        break;
      case 0x1d2:
        local_188 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d2].Text);
        uVar10 = uVar10 | 1;
        break;
      case 0x1d3:
        local_190 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d3].Text);
        uVar10 = uVar10 | 2;
        break;
      case 0x1d4:
        local_198 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d4].Text);
        uVar10 = uVar10 | 4;
        break;
      case 0x1d5:
        local_1b8 = UDMFParserBase::CheckFloat
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d5].Text);
        uVar10 = uVar10 | 8;
        break;
      case 0x1d6:
        iVar8 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d6].Text);
        sec->damageamount = iVar8;
        break;
      case 0x1d7:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d7].Text);
        FNameNoInit::operator=(local_170,pcVar11);
        break;
      case 0x1d8:
        iVar8 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d8].Text);
        sVar7 = 1;
        if (1 < (short)iVar8) {
          sVar7 = (short)iVar8;
        }
        sec->damageinterval = sVar7;
        break;
      case 0x1d9:
        iVar8 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1d9].Text);
        sec->leakydamage = (short)iVar8;
        break;
      case 0x1da:
        iVar8 = 0x80;
        lVar12 = 0x1da0;
        goto LAB_0045ee0a;
      case 0x1db:
        iVar8 = 0x400;
        lVar12 = 0x1db0;
LAB_0045ee0a:
        UDMFParserBase::Flag<unsigned_int>
                  (&this->super_UDMFParserBase,local_1c8,iVar8,
                   *(char **)((long)&(FName::NameData.NameArray)->Text + lVar12));
        break;
      case 0x1dc:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1dc].Text);
        FName::FName(&local_1cc,pcVar11);
        iVar8 = P_FindTerrain(&local_1cc);
        sec->terrainnum[0] = iVar8;
        break;
      case 0x1dd:
        pcVar11 = UDMFParserBase::CheckString
                            (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1dd].Text);
        FName::FName(&local_1d0,pcVar11);
        iVar8 = P_FindTerrain(&local_1d0);
        sec->terrainnum[1] = iVar8;
        break;
      default:
        if (key.Index == 0x120) {
          pcVar11 = UDMFParserBase::CheckString
                              (&this->super_UDMFParserBase,FName::NameData.NameArray[0x120].Text);
          FString::operator=(&tagstring,pcVar11);
        }
      }
switchD_0045e744_caseD_1b0:
      FVar4.Index = key.Index;
      if ((((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) &&
         (iVar8 = strncasecmp("user_",FName::NameData.NameArray[key.Index].Text,5), sec = local_180,
         iVar8 == 0)) {
        local_1d4.Index = FVar4.Index;
        AddUserKey(this,&local_1d4,2,index);
        sec = local_180;
      }
      goto LAB_0045e58a;
    }
    iVar8 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11f].Text);
    FTagManager::AddSectorTag(&tagManager,index,iVar8);
  } while( true );
  uVar9 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,FName::NameData.NameArray[0xed].Text)
  ;
  uVar6 = (ushort)uVar9;
  sec->special = uVar6;
  if (this->isTranslated == true) {
    iVar8 = P_TranslateSectorSpecial((int)(short)uVar6);
    sec->special = (short)iVar8;
  }
  else if (((this->super_UDMFParserBase).namespc.Index == 10) &&
          ((0xff < uVar6 || ("\x01\x01\x01\x01\x01"[uVar9 & 0xff] == '\0')))) {
    sec->special = 0;
  }
  goto LAB_0045e58a;
}

Assistant:

void ParseSector(sector_t *sec, int index)
	{
		int lightcolor = -1;
		int fadecolor = -1;
		int desaturation = -1;
		int fplaneflags = 0, cplaneflags = 0;
		double fp[4] = { 0 }, cp[4] = { 0 };
		FString tagstring;

		memset(sec, 0, sizeof(*sec));
		sec->lightlevel = 160;
		sec->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		sec->SetYScale(sector_t::floor, 1.);
		sec->SetXScale(sector_t::ceiling, 1.);
		sec->SetYScale(sector_t::ceiling, 1.);
		sec->SetAlpha(sector_t::floor, 1.);
		sec->SetAlpha(sector_t::ceiling, 1.);
		sec->thinglist = nullptr;
		sec->touching_thinglist = nullptr;		// phares 3/14/98
		sec->render_thinglist = nullptr;
		sec->touching_renderthings = nullptr;
		sec->seqType = (level.flags & LEVEL_SNDSEQTOTALCTRL) ? 0 : -1;
		sec->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		sec->prevsec = -1;	// stair retriggering until build completes
		sec->heightsec = NULL;	// sector used to get floor and ceiling height
		sec->sectornum = index;
		sec->damageinterval = 32;
		sec->terrainnum[sector_t::ceiling] = sec->terrainnum[sector_t::floor] = -1;
		if (floordrop) sec->Flags = SECF_FLOORDROP;
		// killough 3/7/98: end changes

		sec->gravity = 1.;	// [RH] Default sector gravity of 1.0
		sec->ZoneNumber = 0xFFFF;

		// killough 8/28/98: initialize all sectors to normal friction
		sec->friction = ORIG_FRICTION;
		sec->movefactor = ORIG_FRICTION_FACTOR;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Heightfloor:
				sec->SetPlaneTexZ(sector_t::floor, CheckFloat(key));
				continue;

			case NAME_Heightceiling:
				sec->SetPlaneTexZ(sector_t::ceiling, CheckFloat(key));
				continue;

			case NAME_Texturefloor:
				SetTexture(sec, index, sector_t::floor, CheckString(key), missingTex, false);
				continue;

			case NAME_Textureceiling:
				SetTexture(sec, index, sector_t::ceiling, CheckString(key), missingTex, false);
				continue;

			case NAME_Lightlevel:
				sec->lightlevel = sector_t::ClampLight(CheckInt(key));
				continue;

			case NAME_Special:
				sec->special = (short)CheckInt(key);
				if (isTranslated) sec->special = P_TranslateSectorSpecial(sec->special);
				else if (namespc == NAME_Hexen)
				{
					if (sec->special < 0 || sec->special > 255 || !HexenSectorSpecialOk[sec->special])
						sec->special = 0;	// NULL all unknown specials
				}
				continue;

			case NAME_Id:
				tagManager.AddSectorTag(index, CheckInt(key));
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
				case NAME_Xpanningfloor:
					sec->SetXOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Ypanningfloor:
					sec->SetYOffset(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xpanningceiling:
					sec->SetXOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Ypanningceiling:
					sec->SetYOffset(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Xscalefloor:
					sec->SetXScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Yscalefloor:
					sec->SetYScale(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Xscaleceiling:
					sec->SetXScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Yscaleceiling:
					sec->SetYScale(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Rotationfloor:
					sec->SetAngle(sector_t::floor, CheckAngle(key));
					continue;

				case NAME_Rotationceiling:
					sec->SetAngle(sector_t::ceiling, CheckAngle(key));
					continue;

				case NAME_Lightfloor:
					sec->SetPlaneLight(sector_t::floor, CheckInt(key));
					continue;

				case NAME_Lightceiling:
					sec->SetPlaneLight(sector_t::ceiling, CheckInt(key));
					continue;

				case NAME_Alphafloor:
					sec->SetAlpha(sector_t::floor, CheckFloat(key));
					continue;

				case NAME_Alphaceiling:
					sec->SetAlpha(sector_t::ceiling, CheckFloat(key));
					continue;

				case NAME_Renderstylefloor:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::floor, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstylefloor'\n", str);
					continue;
				}

				case NAME_Renderstyleceiling:
				{
					const char *str = CheckString(key);
					if (!stricmp(str, "translucent")) sec->ChangeFlags(sector_t::ceiling, PLANEF_ADDITIVE, 0);
					else if (!stricmp(str, "add")) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ADDITIVE);
					else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyleceiling'\n", str);
					continue;
				}

				case NAME_Lightfloorabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::floor, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::floor, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Lightceilingabsolute:
					if (CheckBool(key)) sec->ChangeFlags(sector_t::ceiling, 0, PLANEF_ABSLIGHTING);
					else sec->ChangeFlags(sector_t::ceiling, PLANEF_ABSLIGHTING, 0);
					continue;

				case NAME_Gravity:
					sec->gravity = CheckFloat(key);
					continue;

				case NAME_Lightcolor:
					lightcolor = CheckInt(key);
					continue;

				case NAME_Fadecolor:
					fadecolor = CheckInt(key);
					continue;

				case NAME_Desaturation:
					desaturation = int(255*CheckFloat(key));
					continue;

				case NAME_Silent:
					Flag(sec->Flags, SECF_SILENT, key);
					continue;

				case NAME_NoRespawn:
					Flag(sec->Flags, SECF_NORESPAWN, key);
					continue;

				case NAME_Nofallingdamage:
					Flag(sec->Flags, SECF_NOFALLINGDAMAGE, key);
					continue;

				case NAME_Dropactors:
					Flag(sec->Flags, SECF_FLOORDROP, key);
					continue;

				case NAME_SoundSequence:
					sec->SeqName = CheckString(key);
					sec->seqType = -1;
					continue;

				case NAME_hidden:
					Flag(sec->MoreFlags, SECF_HIDDEN, key);
					break;

				case NAME_Waterzone:
					Flag(sec->MoreFlags, SECF_UNDERWATER, key);
					break;

				case NAME_floorplane_a:
					fplaneflags |= 1;
					fp[0] = CheckFloat(key);
					break;

				case NAME_floorplane_b:
					fplaneflags |= 2;
					fp[1] = CheckFloat(key);
					break;

				case NAME_floorplane_c:
					fplaneflags |= 4;
					fp[2] = CheckFloat(key);
					break;

				case NAME_floorplane_d:
					fplaneflags |= 8;
					fp[3] = CheckFloat(key);
					break;

				case NAME_ceilingplane_a:
					cplaneflags |= 1;
					cp[0] = CheckFloat(key);
					break;

				case NAME_ceilingplane_b:
					cplaneflags |= 2;
					cp[1] = CheckFloat(key);
					break;

				case NAME_ceilingplane_c:
					cplaneflags |= 4;
					cp[2] = CheckFloat(key);
					break;

				case NAME_ceilingplane_d:
					cplaneflags |= 8;
					cp[3] = CheckFloat(key);
					break;

				case NAME_damageamount:
					sec->damageamount = CheckInt(key);
					break;

				case NAME_damagetype:
					sec->damagetype = CheckString(key);
					break;

				case NAME_damageinterval:
					sec->damageinterval = CheckInt(key);
					if (sec->damageinterval < 1) sec->damageinterval = 1;
					break;

				case NAME_leakiness:
					sec->leakydamage = CheckInt(key);
					break;

				case NAME_damageterraineffect:
					Flag(sec->Flags, SECF_DMGTERRAINFX, key);
					break;

				case NAME_damagehazard:
					Flag(sec->Flags, SECF_HAZARD, key);
					break;

				case NAME_floorterrain:
					sec->terrainnum[sector_t::floor] = P_FindTerrain(CheckString(key));
					break;

				case NAME_ceilingterrain:
					sec->terrainnum[sector_t::ceiling] = P_FindTerrain(CheckString(key));
					break;

				case NAME_MoreIds:
					// delay parsing of the tag string until parsing of the sector is complete
					// This ensures that the ID is always the first tag in the list.
					tagstring = CheckString(key);
					break;

				case NAME_portal_ceil_blocksound:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_ceil_disabled:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_ceil_nopass:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_ceil_norender:
					Flag(sec->planes[sector_t::ceiling].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_ceil_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::ceiling].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::ceiling].Flags |= PLANEF_ADDITIVE;
					break;
				
				case NAME_portal_floor_blocksound:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_BLOCKSOUND, key);
					break;

				case NAME_portal_floor_disabled:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_DISABLED, key);
					break;

				case NAME_portal_floor_nopass:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NOPASS, key);
					break;

				case NAME_portal_floor_norender:
					Flag(sec->planes[sector_t::floor].Flags, PLANEF_NORENDER, key);
					break;

				case NAME_portal_floor_overlaytype:
					if (!stricmp(CheckString(key), "translucent")) sec->planes[sector_t::floor].Flags &= ~PLANEF_ADDITIVE;
					else if (!stricmp(CheckString(key), "additive")) sec->planes[sector_t::floor].Flags |= PLANEF_ADDITIVE;
					break;

				// These two are used by Eternity for something I do not understand.
				//case NAME_portal_ceil_useglobaltex:
				//case NAME_portal_floor_useglobaltex:
					
				default:
					break;
			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Sector, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddSectorTag(index, sc.Number);
			}
		}

		if (sec->damageamount == 0)
		{
			// If no damage is set, clear all other related properties so that they do not interfere
			// with other means of setting them.
			sec->damagetype = NAME_None;
			sec->damageinterval = 0;
			sec->leakydamage = 0;
			sec->Flags &= ~SECF_DAMAGEFLAGS;
		}
		
		// Reset the planes to their defaults if not all of the plane equation's parameters were found.
		if (fplaneflags != 15)
		{
			sec->floorplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::floor), sector_t::floor);
		}
		else
		{
			// normalize the vector, it must have a length of 1
			DVector3 n = DVector3(fp[0], fp[1], fp[2]).Unit();
			sec->floorplane.set(n.X, n.Y, n.Z, fp[3]);
		}
		if (cplaneflags != 15)
		{
			sec->ceilingplane.SetAtHeight(sec->GetPlaneTexZ(sector_t::ceiling), sector_t::ceiling);
		}
		else
		{
			DVector3 n = DVector3(cp[0], cp[1], cp[2]).Unit();
			sec->ceilingplane.set(n.X, n.Y, n.Z, cp[3]);
		}

		if (lightcolor == -1 && fadecolor == -1 && desaturation == -1)
		{
			// [RH] Sectors default to white light with the default fade.
			//		If they are outside (have a sky ceiling), they use the outside fog.
			if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
			{
				if (fogMap == NULL)
					fogMap = GetSpecialLights(PalEntry(255, 255, 255), level.outsidefog, 0);
				sec->ColorMap = fogMap;
			}
			else
			{
				if (normMap == NULL)
					normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
				sec->ColorMap = normMap;
			}
		}
		else
		{
			if (lightcolor == -1) lightcolor = PalEntry(255,255,255);
			if (fadecolor == -1)
			{
				if (level.outsidefog != 0xff000000 && (sec->GetTexture(sector_t::ceiling) == skyflatnum || (sec->special & 0xff) == Sector_Outside))
					fadecolor = level.outsidefog;
				else
					fadecolor = level.fadeto;
			}
			if (desaturation == -1) desaturation = NormalLight.Desaturate;

			sec->ColorMap = GetSpecialLights (lightcolor, fadecolor, desaturation);
		}
	}